

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O0

int main(void)

{
  string **this;
  function<unsigned_long_long_()> local_1030;
  __cxx11 local_1010 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ff0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fd0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fb0 [32];
  function<unsigned_long_long_()> local_f90;
  __cxx11 local_f70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f10 [32];
  function<unsigned_long_long_()> local_ef0;
  __cxx11 local_ed0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e70 [32];
  function<unsigned_long_long_()> local_e50;
  __cxx11 local_e30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e10 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd0 [32];
  function<unsigned_long_long_()> local_db0;
  __cxx11 local_d90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d30 [32];
  function<unsigned_long_long_()> local_d10;
  __cxx11 local_cf0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c90 [32];
  function<unsigned_long_long_()> local_c70;
  __cxx11 local_c50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c10 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf0 [32];
  function<unsigned_long_long_()> local_bd0;
  __cxx11 local_bb0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b50 [32];
  function<unsigned_long_long_()> local_b30;
  __cxx11 local_b10 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0 [32];
  function<unsigned_long_long_()> local_a90;
  __cxx11 local_a70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10 [32];
  function<unsigned_long_long_()> local_9f0;
  __cxx11 local_9d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970 [32];
  function<unsigned_long_long_()> local_950;
  __cxx11 local_930 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0 [32];
  function<unsigned_long_long_()> local_8b0;
  __cxx11 local_890 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830 [32];
  function<unsigned_long_long_()> local_810;
  __cxx11 local_7f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790 [32];
  function<unsigned_long_long_()> local_770;
  __cxx11 local_750 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0 [32];
  function<unsigned_long_long_()> local_6d0;
  __cxx11 local_6b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650 [32];
  function<unsigned_long_long_()> local_630;
  __cxx11 local_610 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0 [32];
  function<unsigned_long_long_()> local_590;
  __cxx11 local_570 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510 [32];
  function<unsigned_long_long_()> local_4f0;
  __cxx11 local_4d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470 [32];
  function<unsigned_long_long_()> local_450;
  __cxx11 local_430 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0 [32];
  function<unsigned_long_long_()> local_3b0;
  __cxx11 local_390 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330 [32];
  function<unsigned_long_long_()> local_310;
  __cxx11 local_2f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290 [32];
  function<unsigned_long_long_()> local_270;
  __cxx11 local_250 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0 [32];
  function<unsigned_long_long_()> local_1d0;
  __cxx11 local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150 [32];
  function<unsigned_long_long_()> local_130;
  __cxx11 local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [48];
  undefined1 local_80 [8];
  anon_class_16_2_8fc7c42c func5;
  anon_class_16_2_8fc7c42c func4;
  anon_class_16_2_8fc7c42c func3;
  anon_class_16_2_8fc7c42c func2;
  anon_class_16_2_8fc7c42c func1;
  string value;
  size_t n;
  
  this = &func1.value;
  std::__cxx11::string::string((string *)this);
  func2.value = (string *)0x1dcd6500;
  func3.value = (string *)0x1dcd6500;
  func4.value = (string *)0x1dcd6500;
  func5.value = (string *)0x1dcd6500;
  local_80 = (undefined1  [8])0x1dcd6500;
  func5.n = (size_t)this;
  func4.n = (size_t)this;
  func3.n = (size_t)this;
  func2.n = (size_t)this;
  func1.n = (size_t)this;
  std::__cxx11::string::operator=((string *)this,"7");
  std::__cxx11::to_string(local_110,500000000);
  std::operator+(local_f0,(char *)local_110);
  std::operator+(local_d0,local_f0);
  std::operator+(local_b0,(char *)local_d0);
  std::function<unsigned_long_long()>::function<main::__0&,void>
            ((function<unsigned_long_long()> *)&local_130,(anon_class_16_2_8fc7c42c *)&func2.value);
  measure(local_b0,&local_130);
  std::function<unsigned_long_long_()>::~function(&local_130);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::to_string(local_1b0,500000000);
  std::operator+(local_190,(char *)local_1b0);
  std::operator+(local_170,local_190);
  std::operator+(local_150,(char *)local_170);
  std::function<unsigned_long_long()>::function<main::__1&,void>
            ((function<unsigned_long_long()> *)&local_1d0,(anon_class_16_2_8fc7c42c *)&func3.value);
  measure(local_150,&local_1d0);
  std::function<unsigned_long_long_()>::~function(&local_1d0);
  std::__cxx11::string::~string((string *)local_150);
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::to_string(local_250,500000000);
  std::operator+(local_230,(char *)local_250);
  std::operator+(local_210,local_230);
  std::operator+(local_1f0,(char *)local_210);
  std::function<unsigned_long_long()>::function<main::__2&,void>
            ((function<unsigned_long_long()> *)&local_270,(anon_class_16_2_8fc7c42c *)&func4.value);
  measure(local_1f0,&local_270);
  std::function<unsigned_long_long_()>::~function(&local_270);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::string::~string((string *)local_230);
  std::__cxx11::string::~string((string *)local_250);
  std::__cxx11::to_string(local_2f0,500000000);
  std::operator+(local_2d0,(char *)local_2f0);
  std::operator+(local_2b0,local_2d0);
  std::operator+(local_290,(char *)local_2b0);
  std::function<unsigned_long_long()>::function<main::__3&,void>
            ((function<unsigned_long_long()> *)&local_310,(anon_class_16_2_8fc7c42c *)&func5.value);
  measure(local_290,&local_310);
  std::function<unsigned_long_long_()>::~function(&local_310);
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::string::~string((string *)local_2b0);
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2f0);
  std::__cxx11::to_string(local_390,500000000);
  std::operator+(local_370,(char *)local_390);
  std::operator+(local_350,local_370);
  std::operator+(local_330,(char *)local_350);
  std::function<unsigned_long_long()>::function<main::__4&,void>
            ((function<unsigned_long_long()> *)&local_3b0,(anon_class_16_2_8fc7c42c *)local_80);
  measure(local_330,&local_3b0);
  std::function<unsigned_long_long_()>::~function(&local_3b0);
  std::__cxx11::string::~string((string *)local_330);
  std::__cxx11::string::~string((string *)local_350);
  std::__cxx11::string::~string((string *)local_370);
  std::__cxx11::string::~string((string *)local_390);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::operator=((string *)&func1.value,"874");
  std::__cxx11::to_string(local_430,500000000);
  std::operator+(local_410,(char *)local_430);
  std::operator+(local_3f0,local_410);
  std::operator+(local_3d0,(char *)local_3f0);
  std::function<unsigned_long_long()>::function<main::__0&,void>
            ((function<unsigned_long_long()> *)&local_450,(anon_class_16_2_8fc7c42c *)&func2.value);
  measure(local_3d0,&local_450);
  std::function<unsigned_long_long_()>::~function(&local_450);
  std::__cxx11::string::~string((string *)local_3d0);
  std::__cxx11::string::~string((string *)local_3f0);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)local_430);
  std::__cxx11::to_string(local_4d0,500000000);
  std::operator+(local_4b0,(char *)local_4d0);
  std::operator+(local_490,local_4b0);
  std::operator+(local_470,(char *)local_490);
  std::function<unsigned_long_long()>::function<main::__1&,void>
            ((function<unsigned_long_long()> *)&local_4f0,(anon_class_16_2_8fc7c42c *)&func3.value);
  measure(local_470,&local_4f0);
  std::function<unsigned_long_long_()>::~function(&local_4f0);
  std::__cxx11::string::~string((string *)local_470);
  std::__cxx11::string::~string((string *)local_490);
  std::__cxx11::string::~string((string *)local_4b0);
  std::__cxx11::string::~string((string *)local_4d0);
  std::__cxx11::to_string(local_570,500000000);
  std::operator+(local_550,(char *)local_570);
  std::operator+(local_530,local_550);
  std::operator+(local_510,(char *)local_530);
  std::function<unsigned_long_long()>::function<main::__2&,void>
            ((function<unsigned_long_long()> *)&local_590,(anon_class_16_2_8fc7c42c *)&func4.value);
  measure(local_510,&local_590);
  std::function<unsigned_long_long_()>::~function(&local_590);
  std::__cxx11::string::~string((string *)local_510);
  std::__cxx11::string::~string((string *)local_530);
  std::__cxx11::string::~string((string *)local_550);
  std::__cxx11::string::~string((string *)local_570);
  std::__cxx11::to_string(local_610,500000000);
  std::operator+(local_5f0,(char *)local_610);
  std::operator+(local_5d0,local_5f0);
  std::operator+(local_5b0,(char *)local_5d0);
  std::function<unsigned_long_long()>::function<main::__3&,void>
            ((function<unsigned_long_long()> *)&local_630,(anon_class_16_2_8fc7c42c *)&func5.value);
  measure(local_5b0,&local_630);
  std::function<unsigned_long_long_()>::~function(&local_630);
  std::__cxx11::string::~string((string *)local_5b0);
  std::__cxx11::string::~string((string *)local_5d0);
  std::__cxx11::string::~string((string *)local_5f0);
  std::__cxx11::string::~string((string *)local_610);
  std::__cxx11::to_string(local_6b0,500000000);
  std::operator+(local_690,(char *)local_6b0);
  std::operator+(local_670,local_690);
  std::operator+(local_650,(char *)local_670);
  std::function<unsigned_long_long()>::function<main::__4&,void>
            ((function<unsigned_long_long()> *)&local_6d0,(anon_class_16_2_8fc7c42c *)local_80);
  measure(local_650,&local_6d0);
  std::function<unsigned_long_long_()>::~function(&local_6d0);
  std::__cxx11::string::~string((string *)local_650);
  std::__cxx11::string::~string((string *)local_670);
  std::__cxx11::string::~string((string *)local_690);
  std::__cxx11::string::~string((string *)local_6b0);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::operator=((string *)&func1.value,"123456");
  std::__cxx11::to_string(local_750,500000000);
  std::operator+(local_730,(char *)local_750);
  std::operator+(local_710,local_730);
  std::operator+(local_6f0,(char *)local_710);
  std::function<unsigned_long_long()>::function<main::__0&,void>
            ((function<unsigned_long_long()> *)&local_770,(anon_class_16_2_8fc7c42c *)&func2.value);
  measure(local_6f0,&local_770);
  std::function<unsigned_long_long_()>::~function(&local_770);
  std::__cxx11::string::~string((string *)local_6f0);
  std::__cxx11::string::~string((string *)local_710);
  std::__cxx11::string::~string((string *)local_730);
  std::__cxx11::string::~string((string *)local_750);
  std::__cxx11::to_string(local_7f0,500000000);
  std::operator+(local_7d0,(char *)local_7f0);
  std::operator+(local_7b0,local_7d0);
  std::operator+(local_790,(char *)local_7b0);
  std::function<unsigned_long_long()>::function<main::__1&,void>
            ((function<unsigned_long_long()> *)&local_810,(anon_class_16_2_8fc7c42c *)&func3.value);
  measure(local_790,&local_810);
  std::function<unsigned_long_long_()>::~function(&local_810);
  std::__cxx11::string::~string((string *)local_790);
  std::__cxx11::string::~string((string *)local_7b0);
  std::__cxx11::string::~string((string *)local_7d0);
  std::__cxx11::string::~string((string *)local_7f0);
  std::__cxx11::to_string(local_890,500000000);
  std::operator+(local_870,(char *)local_890);
  std::operator+(local_850,local_870);
  std::operator+(local_830,(char *)local_850);
  std::function<unsigned_long_long()>::function<main::__2&,void>
            ((function<unsigned_long_long()> *)&local_8b0,(anon_class_16_2_8fc7c42c *)&func4.value);
  measure(local_830,&local_8b0);
  std::function<unsigned_long_long_()>::~function(&local_8b0);
  std::__cxx11::string::~string((string *)local_830);
  std::__cxx11::string::~string((string *)local_850);
  std::__cxx11::string::~string((string *)local_870);
  std::__cxx11::string::~string((string *)local_890);
  std::__cxx11::to_string(local_930,500000000);
  std::operator+(local_910,(char *)local_930);
  std::operator+(local_8f0,local_910);
  std::operator+(local_8d0,(char *)local_8f0);
  std::function<unsigned_long_long()>::function<main::__3&,void>
            ((function<unsigned_long_long()> *)&local_950,(anon_class_16_2_8fc7c42c *)&func5.value);
  measure(local_8d0,&local_950);
  std::function<unsigned_long_long_()>::~function(&local_950);
  std::__cxx11::string::~string((string *)local_8d0);
  std::__cxx11::string::~string((string *)local_8f0);
  std::__cxx11::string::~string((string *)local_910);
  std::__cxx11::string::~string((string *)local_930);
  std::__cxx11::to_string(local_9d0,500000000);
  std::operator+(local_9b0,(char *)local_9d0);
  std::operator+(local_990,local_9b0);
  std::operator+(local_970,(char *)local_990);
  std::function<unsigned_long_long()>::function<main::__4&,void>
            ((function<unsigned_long_long()> *)&local_9f0,(anon_class_16_2_8fc7c42c *)local_80);
  measure(local_970,&local_9f0);
  std::function<unsigned_long_long_()>::~function(&local_9f0);
  std::__cxx11::string::~string((string *)local_970);
  std::__cxx11::string::~string((string *)local_990);
  std::__cxx11::string::~string((string *)local_9b0);
  std::__cxx11::string::~string((string *)local_9d0);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::operator=((string *)&func1.value,"12345654666646");
  std::__cxx11::to_string(local_a70,500000000);
  std::operator+(local_a50,(char *)local_a70);
  std::operator+(local_a30,local_a50);
  std::operator+(local_a10,(char *)local_a30);
  std::function<unsigned_long_long()>::function<main::__0&,void>
            ((function<unsigned_long_long()> *)&local_a90,(anon_class_16_2_8fc7c42c *)&func2.value);
  measure(local_a10,&local_a90);
  std::function<unsigned_long_long_()>::~function(&local_a90);
  std::__cxx11::string::~string((string *)local_a10);
  std::__cxx11::string::~string((string *)local_a30);
  std::__cxx11::string::~string((string *)local_a50);
  std::__cxx11::string::~string((string *)local_a70);
  std::__cxx11::to_string(local_b10,500000000);
  std::operator+(local_af0,(char *)local_b10);
  std::operator+(local_ad0,local_af0);
  std::operator+(local_ab0,(char *)local_ad0);
  std::function<unsigned_long_long()>::function<main::__1&,void>
            ((function<unsigned_long_long()> *)&local_b30,(anon_class_16_2_8fc7c42c *)&func3.value);
  measure(local_ab0,&local_b30);
  std::function<unsigned_long_long_()>::~function(&local_b30);
  std::__cxx11::string::~string((string *)local_ab0);
  std::__cxx11::string::~string((string *)local_ad0);
  std::__cxx11::string::~string((string *)local_af0);
  std::__cxx11::string::~string((string *)local_b10);
  std::__cxx11::to_string(local_bb0,500000000);
  std::operator+(local_b90,(char *)local_bb0);
  std::operator+(local_b70,local_b90);
  std::operator+(local_b50,(char *)local_b70);
  std::function<unsigned_long_long()>::function<main::__2&,void>
            ((function<unsigned_long_long()> *)&local_bd0,(anon_class_16_2_8fc7c42c *)&func4.value);
  measure(local_b50,&local_bd0);
  std::function<unsigned_long_long_()>::~function(&local_bd0);
  std::__cxx11::string::~string((string *)local_b50);
  std::__cxx11::string::~string((string *)local_b70);
  std::__cxx11::string::~string((string *)local_b90);
  std::__cxx11::string::~string((string *)local_bb0);
  std::__cxx11::to_string(local_c50,500000000);
  std::operator+(local_c30,(char *)local_c50);
  std::operator+(local_c10,local_c30);
  std::operator+(local_bf0,(char *)local_c10);
  std::function<unsigned_long_long()>::function<main::__3&,void>
            ((function<unsigned_long_long()> *)&local_c70,(anon_class_16_2_8fc7c42c *)&func5.value);
  measure(local_bf0,&local_c70);
  std::function<unsigned_long_long_()>::~function(&local_c70);
  std::__cxx11::string::~string((string *)local_bf0);
  std::__cxx11::string::~string((string *)local_c10);
  std::__cxx11::string::~string((string *)local_c30);
  std::__cxx11::string::~string((string *)local_c50);
  std::__cxx11::to_string(local_cf0,500000000);
  std::operator+(local_cd0,(char *)local_cf0);
  std::operator+(local_cb0,local_cd0);
  std::operator+(local_c90,(char *)local_cb0);
  std::function<unsigned_long_long()>::function<main::__4&,void>
            ((function<unsigned_long_long()> *)&local_d10,(anon_class_16_2_8fc7c42c *)local_80);
  measure(local_c90,&local_d10);
  std::function<unsigned_long_long_()>::~function(&local_d10);
  std::__cxx11::string::~string((string *)local_c90);
  std::__cxx11::string::~string((string *)local_cb0);
  std::__cxx11::string::~string((string *)local_cd0);
  std::__cxx11::string::~string((string *)local_cf0);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::operator=((string *)&func1.value,"16323949897939569634");
  std::__cxx11::to_string(local_d90,500000000);
  std::operator+(local_d70,(char *)local_d90);
  std::operator+(local_d50,local_d70);
  std::operator+(local_d30,(char *)local_d50);
  std::function<unsigned_long_long()>::function<main::__0&,void>
            ((function<unsigned_long_long()> *)&local_db0,(anon_class_16_2_8fc7c42c *)&func2.value);
  measure(local_d30,&local_db0);
  std::function<unsigned_long_long_()>::~function(&local_db0);
  std::__cxx11::string::~string((string *)local_d30);
  std::__cxx11::string::~string((string *)local_d50);
  std::__cxx11::string::~string((string *)local_d70);
  std::__cxx11::string::~string((string *)local_d90);
  std::__cxx11::to_string(local_e30,500000000);
  std::operator+(local_e10,(char *)local_e30);
  std::operator+(local_df0,local_e10);
  std::operator+(local_dd0,(char *)local_df0);
  std::function<unsigned_long_long()>::function<main::__1&,void>
            ((function<unsigned_long_long()> *)&local_e50,(anon_class_16_2_8fc7c42c *)&func3.value);
  measure(local_dd0,&local_e50);
  std::function<unsigned_long_long_()>::~function(&local_e50);
  std::__cxx11::string::~string((string *)local_dd0);
  std::__cxx11::string::~string((string *)local_df0);
  std::__cxx11::string::~string((string *)local_e10);
  std::__cxx11::string::~string((string *)local_e30);
  std::__cxx11::to_string(local_ed0,500000000);
  std::operator+(local_eb0,(char *)local_ed0);
  std::operator+(local_e90,local_eb0);
  std::operator+(local_e70,(char *)local_e90);
  std::function<unsigned_long_long()>::function<main::__2&,void>
            ((function<unsigned_long_long()> *)&local_ef0,(anon_class_16_2_8fc7c42c *)&func4.value);
  measure(local_e70,&local_ef0);
  std::function<unsigned_long_long_()>::~function(&local_ef0);
  std::__cxx11::string::~string((string *)local_e70);
  std::__cxx11::string::~string((string *)local_e90);
  std::__cxx11::string::~string((string *)local_eb0);
  std::__cxx11::string::~string((string *)local_ed0);
  std::__cxx11::to_string(local_f70,500000000);
  std::operator+(local_f50,(char *)local_f70);
  std::operator+(local_f30,local_f50);
  std::operator+(local_f10,(char *)local_f30);
  std::function<unsigned_long_long()>::function<main::__3&,void>
            ((function<unsigned_long_long()> *)&local_f90,(anon_class_16_2_8fc7c42c *)&func5.value);
  measure(local_f10,&local_f90);
  std::function<unsigned_long_long_()>::~function(&local_f90);
  std::__cxx11::string::~string((string *)local_f10);
  std::__cxx11::string::~string((string *)local_f30);
  std::__cxx11::string::~string((string *)local_f50);
  std::__cxx11::string::~string((string *)local_f70);
  std::__cxx11::to_string(local_1010,500000000);
  std::operator+(local_ff0,(char *)local_1010);
  std::operator+(local_fd0,local_ff0);
  std::operator+(local_fb0,(char *)local_fd0);
  std::function<unsigned_long_long()>::function<main::__4&,void>
            ((function<unsigned_long_long()> *)&local_1030,(anon_class_16_2_8fc7c42c *)local_80);
  measure(local_fb0,&local_1030);
  std::function<unsigned_long_long_()>::~function(&local_1030);
  std::__cxx11::string::~string((string *)local_fb0);
  std::__cxx11::string::~string((string *)local_fd0);
  std::__cxx11::string::~string((string *)local_ff0);
  std::__cxx11::string::~string((string *)local_1010);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&func1.value);
  return 0;
}

Assistant:

int main() {
  std::size_t const n = 500 * 1000 * 1000;
  std::string value;

  // callback functions for the benchmark
   
  // using std::stoull
  auto func1 = [n, &value]() {
    volatile unsigned long long total = 0;
    for (std::size_t i = 0; i < n; ++i) {
      std::size_t nc;
      auto result = std::stoull(value, &nc);
      // in here so compiler does not optimize it away
      total += result;
    }
    return total;
  };
  
  // using std::strtoull 
  auto func2 = [n, &value]() {
    volatile unsigned long long total = 0;
    for (std::size_t i = 0; i < n; ++i) {
      char* endptr;
      auto result = std::strtoull(value.c_str(), &endptr, 10);
      // in here so compiler does not optimize it away
      total += result;
    }
    return total;
  };
  
  // using jsteemann::atoi
  auto func3 = [n, &value]() {
    volatile unsigned long long total = 0;
    for (std::size_t i = 0; i < n; ++i) {
      bool valid;
      auto result = jsteemann::atoi<unsigned long long>(value.data(), value.data() + value.size(), valid);
      // in here so compiler does not optimize it away
      total += result;
    }
    return total;
  };
  
  
  // using jsteemann::atoi_positive
  auto func4 = [n, &value]() {
    volatile unsigned long long total = 0;
    for (std::size_t i = 0; i < n; ++i) {
      bool valid;
      auto result = jsteemann::atoi_positive<unsigned long long>(value.data(), value.data() + value.size(), valid);
      // in here so compiler does not optimize it away
      total += result;
    }
    return total;
  };
  
  
  // using jsteemann::atoi_positive_unchecked
  auto func5 = [n, &value]() {
    volatile unsigned long long total = 0;
    for (std::size_t i = 0; i < n; ++i) {
      auto result = jsteemann::atoi_positive_unchecked<unsigned long long>(value.data(), value.data() + value.size());
      // in here so compiler does not optimize it away
      total += result;
    }
    return total;
  };
  
  
  // use a very short value for starting 
  value = "7";
  (void) measure(std::to_string(n) + " iterations of std::stoull, string '" + value + "'", func1);
  (void) measure(std::to_string(n) + " iterations of std::strtoull, string '" + value + "'", func2);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi, string '" + value + "'", func3);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive, string '" + value + "'", func4);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive_unchecked, string '" + value + "'", func5);
  std::cout << std::endl;
  
  
  // three bytes now
  value = "874";
  (void) measure(std::to_string(n) + " iterations of std::stoull, string '" + value + "'", func1);
  (void) measure(std::to_string(n) + " iterations of std::strtoull, string '" + value + "'", func2);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi, string '" + value + "'", func3);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive, string '" + value + "'", func4);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive_unchecked, string '" + value + "'", func5);
  std::cout << std::endl;
    

  // try a slightly longer value now
  value = "123456";
  (void) measure(std::to_string(n) + " iterations of std::stoull, string '" + value + "'", func1);
  (void) measure(std::to_string(n) + " iterations of std::strtoull, string '" + value + "'", func2);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi, string '" + value + "'", func3);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive, string '" + value + "'", func4);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive_unchecked, string '" + value + "'", func5);
  std::cout << std::endl;
  
  
  // it only gets longer
  value = "12345654666646";
  (void) measure(std::to_string(n) + " iterations of std::stoull, string '" + value + "'", func1);
  (void) measure(std::to_string(n) + " iterations of std::strtoull, string '" + value + "'", func2);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi, string '" + value + "'", func3);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive, string '" + value + "'", func4);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive_unchecked, string '" + value + "'", func5);
  std::cout << std::endl;
  
  
  // try a rather long value now
  value = "16323949897939569634";
  (void) measure(std::to_string(n) + " iterations of std::stoull, string '" + value + "'", func1);
  (void) measure(std::to_string(n) + " iterations of std::strtoull, string '" + value + "'", func2);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi, string '" + value + "'", func3);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive, string '" + value + "'", func4);
  (void) measure(std::to_string(n) + " iterations of jsteemann::atoi_positive_unchecked, string '" + value + "'", func5);
  std::cout << std::endl;
}